

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_type __thiscall llvm::StringRef::find_first_not_of(StringRef *this,StringRef Chars,size_t From)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  size_type i;
  size_t Index;
  ulong uVar4;
  StringRef Chars_local;
  bitset<256UL> CharBits;
  
  Chars_local.Length = Chars.Length;
  Chars_local.Data = Chars.Data;
  CharBits.super__Base_bitset<4UL>._M_w[2] = 0;
  CharBits.super__Base_bitset<4UL>._M_w[3] = 0;
  CharBits.super__Base_bitset<4UL>._M_w[0] = 0;
  CharBits.super__Base_bitset<4UL>._M_w[1] = 0;
  for (Index = 0; Index != Chars_local.Length; Index = Index + 1) {
    bVar2 = operator[](&Chars_local,Index);
    std::bitset<256UL>::set(&CharBits,(ulong)bVar2,true);
  }
  uVar1 = this->Length;
  if (uVar1 < From) {
    From = uVar1;
  }
  while ((uVar4 = 0xffffffffffffffff, uVar1 != From &&
         (bVar3 = std::bitset<256UL>::test(&CharBits,(ulong)(byte)this->Data[From]), uVar4 = From,
         bVar3))) {
    From = From + 1;
  }
  return uVar4;
}

Assistant:

StringRef::size_type StringRef::find_first_not_of(StringRef Chars,
                                                  size_t From) const {
  std::bitset<1 << CHAR_BIT> CharBits;
  for (size_type i = 0; i != Chars.size(); ++i)
    CharBits.set((unsigned char)Chars[i]);

  for (size_type i = std::min(From, Length), e = Length; i != e; ++i)
    if (!CharBits.test((unsigned char)Data[i]))
      return i;
  return npos;
}